

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  int iVar1;
  int in_EDX;
  uint in_ESI;
  secp256k1_scalar *in_RDI;
  
  if ((in_EDX != 0) && (in_ESI < 0x20)) {
    *in_RDI = (1 << ((byte)in_ESI & 0x1f)) + *in_RDI;
  }
  if (0x1f < in_ESI) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_low_impl.h"
            ,0x2e,"test condition failed: bit < 32");
    abort();
  }
  if (0xfffffff2 < (1 << ((byte)in_ESI & 0x1f)) - 1U) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_low_impl.h"
            ,0x30,
            "test condition failed: ((uint32_t)1 << bit) - 1 <= UINT32_MAX - EXHAUSTIVE_TEST_ORDER")
    ;
    abort();
  }
  iVar1 = secp256k1_scalar_check_overflow(in_RDI);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_low_impl.h"
            ,0x31,"test condition failed: secp256k1_scalar_check_overflow(r) == 0");
    abort();
  }
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    if (flag && bit < 32)
        *r += ((uint32_t)1 << bit);
#ifdef VERIFY
    VERIFY_CHECK(bit < 32);
    /* Verify that adding (1 << bit) will not overflow any in-range scalar *r by overflowing the underlying uint32_t. */
    VERIFY_CHECK(((uint32_t)1 << bit) - 1 <= UINT32_MAX - EXHAUSTIVE_TEST_ORDER);
    VERIFY_CHECK(secp256k1_scalar_check_overflow(r) == 0);
#endif
}